

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  undefined1 auVar1 [32];
  U32 UVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [32];
  
  UVar2 = size + 0xf;
  if (-1 < (int)size) {
    UVar2 = size;
  }
  if ((size & 0xf) == 0) {
    if (-1 < (int)size) {
      if (0xf < size) {
        auVar6._4_4_ = reducerValue;
        auVar6._0_4_ = reducerValue;
        auVar6._8_4_ = reducerValue;
        auVar6._12_4_ = reducerValue;
        auVar6._16_4_ = reducerValue;
        auVar6._20_4_ = reducerValue;
        auVar6._24_4_ = reducerValue;
        auVar6._28_4_ = reducerValue;
        iVar4 = 0;
        iVar3 = 0;
        do {
          lVar5 = 0;
          do {
            auVar1 = vpmaxud_avx2(auVar6,*(undefined1 (*) [32])(table + iVar3 + lVar5));
            auVar1 = vpsubd_avx2(auVar1,auVar6);
            *(undefined1 (*) [32])(table + iVar3 + lVar5) = auVar1;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x10);
          iVar4 = iVar4 + 1;
          iVar3 = iVar3 + 0x10;
        } while (iVar4 != (int)UVar2 >> 4);
      }
      return;
    }
    __assert_fail("size < (1U<<31)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3178,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3177,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}